

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::FileDescriptorSet::~FileDescriptorSet(FileDescriptorSet *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__FileDescriptorSet_003c6e10;
  pcVar2 = (this->unknown_fields_)._M_dataplus._M_p;
  paVar1 = &(this->unknown_fields_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<perfetto::protos::gen::FileDescriptorProto,_std::allocator<perfetto::protos::gen::FileDescriptorProto>_>
  ::~vector(&this->file_);
  return;
}

Assistant:

FileDescriptorSet::~FileDescriptorSet() = default;